

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMpsFF.cpp
# Opt level: O0

FreeFormatParserReturnCode __thiscall
free_format_parser::HMpsFF::loadProblem
          (HMpsFF *this,HighsLogOptions *log_options,string *filename,HighsModel *model)

{
  uint uVar1;
  uint uVar2;
  bool bVar3;
  HighsInt HVar4;
  undefined8 uVar5;
  reference ppVar6;
  reference pvVar7;
  size_type sVar8;
  size_type sVar9;
  reference pvVar10;
  undefined4 *in_RCX;
  HighsLogOptions *in_RSI;
  long in_RDI;
  size_t iCol;
  bool is_mip;
  HighsInt status;
  pair<int,_double> i;
  iterator __end1;
  iterator __begin1;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *__range1;
  FreeFormatParserReturnCode result;
  HighsHessian *hessian;
  HighsLp *lp;
  string *in_stack_00000328;
  HighsLogOptions *in_stack_00000330;
  HMpsFF *in_stack_00000338;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
  *in_stack_ffffffffffffff28;
  HighsLp *in_stack_ffffffffffffff30;
  HighsLogOptions *in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff40;
  uint in_stack_ffffffffffffff44;
  string local_a0 [16];
  HighsLogOptions *in_stack_ffffffffffffff70;
  HMpsFF *in_stack_ffffffffffffff78;
  size_type local_80;
  HighsHessian *in_stack_ffffffffffffff90;
  HighsLp *in_stack_ffffffffffffff98;
  __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
  local_58;
  long local_50;
  undefined8 local_48;
  undefined4 in_stack_ffffffffffffffc0;
  HMpsFF *this_00;
  FreeFormatParserReturnCode local_4;
  
  *(undefined1 *)(in_RDI + 8) = 0;
  this_00 = (HMpsFF *)(in_RCX + 0xe6);
  local_4 = parse(in_stack_00000338,in_stack_00000330,in_stack_00000328);
  if (local_4 == kSuccess) {
    bVar3 = std::
            vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
            ::empty((vector<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>,_std::allocator<std::vector<std::tuple<int,_int,_double>,_std::allocator<std::tuple<int,_int,_double>_>_>_>_>
                     *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
    if (bVar3) {
      bVar3 = std::
              vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
              ::empty((vector<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>,_std::allocator<std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>_>
                       *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
      if (bVar3) {
        bVar3 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::empty((vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                         *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40));
        if (bVar3) {
          if ((*(byte *)(in_RDI + 0x1dc) & 1) != 0) {
            *(undefined1 *)(in_RDI + 8) = 1;
            uVar1 = *(uint *)(in_RDI + 0x200);
            uVar2 = *(uint *)(in_RDI + 0x204);
            uVar5 = std::__cxx11::string::c_str();
            highsLogUser(in_RSI,kWarning,"Linear constraints %d and %d have the same name \"%s\"\n",
                         (ulong)uVar1,(ulong)uVar2,uVar5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x45c718);
          }
          if ((*(byte *)(in_RDI + 0x1dd) & 1) != 0) {
            *(undefined1 *)(in_RDI + 8) = 1;
            in_stack_ffffffffffffff40 = *(uint *)(in_RDI + 0x228);
            in_stack_ffffffffffffff44 = *(uint *)(in_RDI + 0x22c);
            uVar5 = std::__cxx11::string::c_str();
            highsLogUser(in_RSI,kWarning,"Variables %d and %d have the same name \"%s\"\n",
                         (ulong)in_stack_ffffffffffffff40,(ulong)in_stack_ffffffffffffff44,uVar5);
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)0x45c791);
            in_stack_ffffffffffffff38 = in_RSI;
          }
          local_48 = 0;
          std::vector<double,_std::allocator<double>_>::assign
                    ((vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff30,
                     (size_type)in_stack_ffffffffffffff28,(value_type_conflict1 *)0x45c7bd);
          local_50 = in_RDI + 0x300;
          local_58._M_current =
               (pair<int,_double> *)
               std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                         (in_stack_ffffffffffffff28);
          std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                    (in_stack_ffffffffffffff28);
          while (bVar3 = __gnu_cxx::operator!=
                                   ((__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                     *)in_stack_ffffffffffffff30,
                                    (__normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                                     *)in_stack_ffffffffffffff28), bVar3) {
            ppVar6 = __gnu_cxx::
                     __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
                     ::operator*(&local_58);
            in_stack_ffffffffffffff90 = *(HighsHessian **)ppVar6;
            in_stack_ffffffffffffff30 = (HighsLp *)ppVar6->second;
            in_stack_ffffffffffffff98 = in_stack_ffffffffffffff30;
            pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xa0),
                                (long)(int)in_stack_ffffffffffffff90);
            *pvVar7 = (value_type)in_stack_ffffffffffffff30;
            __gnu_cxx::
            __normal_iterator<std::pair<int,_double>_*,_std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>_>
            ::operator++(&local_58);
          }
          HVar4 = fillMatrix(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
          if (HVar4 == 0) {
            HVar4 = fillHessian(this_00,(HighsLogOptions *)
                                        CONCAT44(local_4,in_stack_ffffffffffffffc0));
            if (HVar4 == 0) {
              in_RCX[1] = *(undefined4 *)(in_RDI + 0x18);
              *in_RCX = *(undefined4 *)(in_RDI + 0x1c);
              in_RCX[0x3c] = *(undefined4 *)(in_RDI + 0x48);
              *(undefined8 *)(in_RCX + 0x3e) = *(undefined8 *)(in_RDI + 0x50);
              in_RCX[0x20] = 1;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              sVar8 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)(in_RCX + 0x24));
              if (sVar8 == 0) {
                HighsSparseMatrix::clear((HighsSparseMatrix *)in_stack_ffffffffffffff30);
              }
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              std::__cxx11::string::operator=((string *)(in_RCX + 0x48),(string *)(in_RDI + 0x268));
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff38);
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_ffffffffffffff38);
              bVar3 = false;
              local_80 = 0;
              while (sVar8 = local_80,
                    sVar9 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::size
                                      ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                       (in_RDI + 0x148)), sVar8 < sVar9) {
                pvVar10 = std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator[]
                                    ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                                     (in_RDI + 0x148),local_80);
                if (*pvVar10 != kContinuous) {
                  bVar3 = true;
                  break;
                }
                local_80 = local_80 + 1;
              }
              if (bVar3) {
                std::vector<HighsVarType,_std::allocator<HighsVarType>_>::operator=
                          ((vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                           CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                           (vector<HighsVarType,_std::allocator<HighsVarType>_> *)
                           in_stack_ffffffffffffff38);
              }
              *(undefined4 *)&this_00->time_limit_ = *(undefined4 *)(in_RDI + 0x160);
              *(undefined4 *)((long)&this_00->time_limit_ + 4) = 1;
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
              std::vector<int,_std::allocator<int>_>::operator=
                        ((vector<int,_std::allocator<int>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff38);
              std::vector<double,_std::allocator<double>_>::operator=
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                         (vector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff38);
              sVar8 = std::vector<int,_std::allocator<int>_>::size
                                ((vector<int,_std::allocator<int>_> *)&this_00->warning_issued_);
              if (sVar8 == 0) {
                HighsHessian::clear((HighsHessian *)in_stack_ffffffffffffff30);
              }
              findModelObjectiveName_abi_cxx11_(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90)
              ;
              std::__cxx11::string::operator=((string *)(in_RCX + 0x48),local_a0);
              std::__cxx11::string::~string(local_a0);
              in_RCX[0x95] = *(undefined4 *)(in_RDI + 0x1d8);
              local_4 = kSuccess;
            }
            else {
              local_4 = kParserError;
            }
          }
          else {
            local_4 = kParserError;
          }
        }
        else {
          highsLogUser(in_RSI,kError,"Cones not supported by HiGHS\n");
          local_4 = kParserError;
        }
      }
      else {
        highsLogUser(in_RSI,kError,"SOS not supported by HiGHS\n");
        local_4 = kParserError;
      }
    }
    else {
      highsLogUser(in_RSI,kError,"Quadratic rows not supported by HiGHS\n");
      local_4 = kParserError;
    }
  }
  return local_4;
}

Assistant:

FreeFormatParserReturnCode HMpsFF::loadProblem(
    const HighsLogOptions& log_options, const std::string filename,
    HighsModel& model) {
  // Keep track of any warnings that are issued so that
  // Highs::readModel can return HighsStatus::kWarning
  warning_issued_ = false;
  HighsLp& lp = model.lp_;
  HighsHessian& hessian = model.hessian_;
  FreeFormatParserReturnCode result = parse(log_options, filename);
  if (result != FreeFormatParserReturnCode::kSuccess) return result;

  if (!qrows_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Quadratic rows not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  if (!sos_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "SOS not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  if (!cone_entries.empty()) {
    highsLogUser(log_options, HighsLogType::kError,
                 "Cones not supported by HiGHS\n");
    return FreeFormatParserReturnCode::kParserError;
  }
  // Duplicate row and column names in MPS files occur if the same row
  // name appears twice in the ROWS section, or if a column name
  // reoccurs in the COLUMNS section after another column has been
  // defined. They are anomalies, but are only handled by a warning in
  // some solvers. Hence, rather than fail, HiGHS does the same.
  //
  // If there are duplicate row (column) names, then they are treated
  // as distinct rows (columns), so the row (column) names array is
  // not valid. Report this for the first instance, and clear the row
  // (column) names array.
  //
  // Note that rowname2idx and colname2idx will return the index
  // corresponding to the first occurrence of the name, so values for
  // rows in the COLUMNS, RHS and RANGES sections, and columns in the
  // BOUNDS and other sections can only be defined for the first
  // occurrence
  if (has_duplicate_row_name_) {
    warning_issued_ = true;
    highsLogUser(log_options, HighsLogType::kWarning,
                 "Linear constraints %d and %d have the same name \"%s\"\n",
                 (int)duplicate_row_name_index0_,
                 (int)duplicate_row_name_index1_, duplicate_row_name_.c_str());
    row_names.clear();
  }
  if (has_duplicate_col_name_) {
    warning_issued_ = true;
    highsLogUser(log_options, HighsLogType::kWarning,
                 "Variables %d and %d have the same name \"%s\"\n",
                 (int)duplicate_col_name_index0_,
                 (int)duplicate_col_name_index1_, duplicate_col_name_.c_str());
    col_names.clear();
  }
  col_cost.assign(num_col, 0);
  for (auto i : coeffobj) col_cost[i.first] = i.second;
  HighsInt status = fillMatrix(log_options);
  if (status) return FreeFormatParserReturnCode::kParserError;
  status = fillHessian(log_options);
  if (status) return FreeFormatParserReturnCode::kParserError;

  lp.num_row_ = num_row;
  lp.num_col_ = num_col;

  lp.sense_ = obj_sense;
  lp.offset_ = obj_offset;

  lp.a_matrix_.format_ = MatrixFormat::kColwise;
  lp.a_matrix_.start_ = std::move(a_start);
  lp.a_matrix_.index_ = std::move(a_index);
  lp.a_matrix_.value_ = std::move(a_value);
  // a must have at least start_[0]=0 for the fictitious column
  // 0
  if (lp.a_matrix_.start_.size() == 0) lp.a_matrix_.clear();
  lp.col_cost_ = std::move(col_cost);
  lp.col_lower_ = std::move(col_lower);
  lp.col_upper_ = std::move(col_upper);
  lp.row_lower_ = std::move(row_lower);
  lp.row_upper_ = std::move(row_upper);

  lp.objective_name_ = objective_name;
  lp.row_names_ = std::move(row_names);
  lp.col_names_ = std::move(col_names);

  // Only set up lp.integrality_ if non-continuous
  bool is_mip = false;
  for (size_t iCol = 0; iCol < col_integrality.size(); iCol++) {
    if (col_integrality[iCol] != HighsVarType::kContinuous) {
      is_mip = true;
      break;
    }
  }
  if (is_mip) lp.integrality_ = std::move(col_integrality);

  hessian.dim_ = q_dim;
  hessian.format_ = HessianFormat::kTriangular;
  hessian.start_ = std::move(q_start);
  hessian.index_ = std::move(q_index);
  hessian.value_ = std::move(q_value);
  // hessian must have at least start_[0]=0 for the fictitious column
  // 0
  if (hessian.start_.size() == 0) hessian.clear();

  // Set the objective name, creating one if necessary
  lp.objective_name_ = findModelObjectiveName(&lp, &hessian);
  lp.cost_row_location_ = cost_row_location;

  return FreeFormatParserReturnCode::kSuccess;
}